

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Mapping.c
# Opt level: O3

void AArch64_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  cs_detail *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Bool _Var5;
  unsigned_short uVar6;
  uint uVar7;
  cs_struct handle;
  undefined1 local_d0 [96];
  cs_opt_value local_70;
  
  uVar6 = insn_find(insns,0x918,id,&h->insn_cache);
  if (uVar6 != 0) {
    insn->id = (uint)insns[uVar6].mapid;
    local_70 = h->detail;
    if (local_70 != CS_OPT_OFF) {
      pcVar1 = insn->detail;
      *(undefined8 *)(pcVar1->regs_read + 8) = *(undefined8 *)(insns[uVar6].regs_use + 8);
      uVar2 = *(undefined8 *)(insns[uVar6].regs_use + 4);
      *(undefined8 *)pcVar1->regs_read = *(undefined8 *)insns[uVar6].regs_use;
      *(undefined8 *)(pcVar1->regs_read + 4) = uVar2;
      uVar7 = count_positive(insns[uVar6].regs_use);
      pcVar1 = insn->detail;
      pcVar1->regs_read_count = (uint8_t)uVar7;
      *(undefined8 *)(pcVar1->regs_write + 0x10) = *(undefined8 *)(insns[uVar6].regs_mod + 0x10);
      uVar2 = *(undefined8 *)insns[uVar6].regs_mod;
      uVar3 = *(undefined8 *)(insns[uVar6].regs_mod + 4);
      uVar4 = *(undefined8 *)(insns[uVar6].regs_mod + 0xc);
      *(undefined8 *)(pcVar1->regs_write + 8) = *(undefined8 *)(insns[uVar6].regs_mod + 8);
      *(undefined8 *)(pcVar1->regs_write + 0xc) = uVar4;
      *(undefined8 *)pcVar1->regs_write = uVar2;
      *(undefined8 *)(pcVar1->regs_write + 4) = uVar3;
      uVar7 = count_positive(insns[uVar6].regs_mod);
      pcVar1 = insn->detail;
      pcVar1->regs_write_count = (uint8_t)uVar7;
      *(undefined8 *)pcVar1->groups = *(undefined8 *)insns[uVar6].groups;
      uVar7 = count_positive8(insns[uVar6].groups);
      insn->detail->groups_count = (uint8_t)uVar7;
      _Var5 = cs_reg_write((csh)local_d0,insn,3);
      (insn->detail->field_6).arm64.update_flags = _Var5;
    }
  }
  return;
}

Assistant:

void AArch64_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	int i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			cs_struct handle;
			handle.detail = h->detail;

			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive8(insns[i].groups);

			insn->detail->arm64.update_flags = cs_reg_write((csh)&handle, insn, ARM64_REG_NZCV);
#endif
		}
	}
}